

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

float64 * gauden_scale_densities_fwd
                    (float64 ***den,uint32 ***den_idx,uint32 *cb,uint32 n_cb,gauden_t *g)

{
  uint uVar1;
  uint uVar2;
  float64 *pfVar3;
  float64 *pfVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  float64 fVar9;
  double dVar10;
  ulong local_48;
  
  if (g->n_top <= g->n_density) {
    pfVar4 = (float64 *)
             __ckd_calloc__((ulong)g->n_feat,8,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                            ,0x50b);
    uVar8 = (ulong)g->n_feat;
    if (uVar8 != 0) {
      uVar5 = 0;
      do {
        pfVar4[uVar5] = -1.8e+307;
        uVar5 = uVar5 + 1;
      } while (uVar8 != uVar5);
    }
    if (n_cb != 0) {
      uVar5 = 0;
      do {
        if (uVar8 != 0) {
          uVar1 = cb[uVar5];
          uVar2 = g->n_top;
          uVar6 = 0;
          do {
            if ((ulong)uVar2 != 0) {
              pfVar3 = den[uVar1][uVar6];
              fVar9 = pfVar4[uVar6];
              uVar7 = 0;
              do {
                dVar10 = (double)pfVar3[uVar7];
                if ((double)fVar9 < dVar10) {
                  pfVar4[uVar6] = (float64)dVar10;
                  fVar9 = (float64)dVar10;
                }
                uVar7 = uVar7 + 1;
              } while (uVar2 != uVar7);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != uVar8);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != n_cb);
    }
    if (uVar8 != 0) {
      uVar5 = 0;
      do {
        pfVar4[uVar5] = (float64)((double)pfVar4[uVar5] + -10.0);
        uVar5 = uVar5 + 1;
      } while (uVar8 != uVar5);
    }
    if (n_cb != 0) {
      local_48 = 0;
      do {
        if (g->n_feat != 0) {
          uVar1 = cb[local_48];
          uVar8 = 0;
          do {
            if (g->n_top != 0) {
              uVar5 = 0;
              do {
                dVar10 = exp((double)den[uVar1][uVar8][uVar5] - (double)pfVar4[uVar8]);
                den[uVar1][uVar8][uVar5] = (float64)dVar10;
                uVar5 = uVar5 + 1;
              } while (uVar5 < g->n_top);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < g->n_feat);
        }
        local_48 = local_48 + 1;
      } while (local_48 != n_cb);
    }
    return pfVar4;
  }
  __assert_fail("g->n_top <= g->n_density",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                ,0x509,
                "float64 *gauden_scale_densities_fwd(float64 ***, uint32 ***, uint32 *, uint32, gauden_t *)"
               );
}

Assistant:

float64 *
gauden_scale_densities_fwd(float64 ***den,		/* density array for a mixture Gaussian */
			   uint32 ***den_idx,
			   uint32 *cb,		/* Codebook indices */
			   uint32 n_cb,		/* total # of codebooks to scale */
			   gauden_t *g)		/* Gaussian density structure */
{
    uint32 i, c, j, k;
    float64 *max_den;

    /* make sure this is true at initialization time */
    assert(g->n_top <= g->n_density);

    max_den = ckd_calloc(g->n_feat, sizeof(float64));

    /* Initialize max_den to some value in the domain */
    for (j = 0; j < g->n_feat; j++) {
	max_den[j] = MIN_IEEE_NORM_NEG_FLOAT64;
    }

    /* Find the max for each feature */
    for (i = 0; i < n_cb; i++) {
	c = cb[i];
	for (j = 0; j < g->n_feat; j++) {
	    for (k = 0; k < g->n_top; k++) {
		if (max_den[j] < den[c][j][k]) {
		    max_den[j] = den[c][j][k];
		}
	    }
	}
    }

    for (j = 0; j < g->n_feat; j++) {
	max_den[j] -= MAX_LOG_DEN;
    }
    
    /* Subtract/Divide max density from others */
    for (i = 0; i < n_cb; i++) {
	c = cb[i];
	for (j = 0; j < g->n_feat; j++) {
	    for (k = 0; k < g->n_top; k++) {
		den[c][j][k] = exp(den[c][j][k] - max_den[j]);
	    }
	}
    }

    return max_den;
}